

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_CheckSignature<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  ScriptFunction *this_00;
  FunctionBody *this_01;
  void *pvVar4;
  int32 hCode;
  ScriptContext *scriptContext;
  
  this_00 = VarTo<Js::ScriptFunction>(*(Var *)(*(long *)(this + 0x120) + (ulong)playout->R0 * 8));
  if ((((this_00->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->attributes &
      DeferredParse) == None) {
    iVar1 = playout->C1;
    lVar2 = *(long *)(this + 0x140);
    this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
    pvVar4 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,AsmJsFunctionInfo);
    if (pvVar4 != (void *)0x0) {
      bVar3 = Wasm::WasmSignature::IsEquivalent<true>
                        ((WasmSignature *)((long)iVar1 * 0x28 + lVar2),
                         *(WasmSignature **)((long)pvVar4 + 0x88));
      if (bVar3) {
        return;
      }
      scriptContext = *(ScriptContext **)(this + 0x78);
      hCode = -0x7ff5e49a;
      goto LAB_00a69e87;
    }
  }
  scriptContext = *(ScriptContext **)(this + 0x78);
  hCode = -0x7ff5e49b;
LAB_00a69e87:
  JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext,hCode,(PCWSTR)0x0);
}

Assistant:

void InterpreterStackFrame::OP_CheckSignature(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        ScriptFunction * func = VarTo<ScriptFunction>(GetRegRawPtr(playout->R0));
        int sigIndex = playout->C1;
        Wasm::WasmSignature * expected = &m_signatures[sigIndex];
        if (func->GetFunctionInfo()->IsDeferredParseFunction())
        {
            // TODO: should be able to assert this once imports are converted to wasm functions
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        AsmJsFunctionInfo * asmInfo = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        if (!asmInfo)
        {
            // TODO: should be able to assert this once imports are converted to wasm functions
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        if (!expected->IsEquivalent(asmInfo->GetWasmSignature()))
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_SignatureMismatch);
        }
#endif
    }